

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_integer.c
# Opt level: O0

int aom_uleb_encode_fixed_size
              (uint64_t value,size_t available,size_t pad_to_size,uint8_t *coded_value,
              size_t *coded_size)

{
  uint8_t byte;
  size_t i;
  uint64_t limit;
  size_t *coded_size_local;
  uint8_t *coded_value_local;
  size_t pad_to_size_local;
  size_t available_local;
  uint64_t value_local;
  int local_4;
  
  if ((((value < 0x100000000) && (coded_value != (uint8_t *)0x0)) && (coded_size != (size_t *)0x0))
     && ((pad_to_size <= available && (pad_to_size < 9)))) {
    if (value < (ulong)(1L << ((char)pad_to_size * '\a' & 0x3fU))) {
      value_local = value;
      for (i = 0; i < pad_to_size; i = i + 1) {
        byte = (byte)value_local & 0x7f;
        value_local = value_local >> 7;
        if (i < pad_to_size - 1) {
          byte = byte | 0x80;
        }
        coded_value[i] = byte;
      }
      *coded_size = pad_to_size;
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int aom_uleb_encode_fixed_size(uint64_t value, size_t available,
                               size_t pad_to_size, uint8_t *coded_value,
                               size_t *coded_size) {
  if (value > kMaximumLeb128Value || !coded_value || !coded_size ||
      available < pad_to_size || pad_to_size > kMaximumLeb128Size) {
    return -1;
  }
  const uint64_t limit = 1ULL << (7 * pad_to_size);
  if (value >= limit) {
    // Can't encode 'value' within 'pad_to_size' bytes
    return -1;
  }

  for (size_t i = 0; i < pad_to_size; ++i) {
    uint8_t byte = value & 0x7f;
    value >>= 7;

    if (i < pad_to_size - 1) byte |= 0x80;  // Signal that more bytes follow.

    *(coded_value + i) = byte;
  }

  assert(value == 0);

  *coded_size = pad_to_size;
  return 0;
}